

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moptional.hpp
# Opt level: O0

MoptIterator<std::vector<int,_std::allocator<int>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
 __thiscall
mopt::Moptional<std::vector<int,_std::allocator<int>_>_>::begin
          (Moptional<std::vector<int,_std::allocator<int>_>_> *this)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *this_00;
  iterator _underlying;
  Moptional<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)this);
  if (bVar1) {
    this_00 = std::optional<std::vector<int,_std::allocator<int>_>_>::operator->(&this->internal_);
    _underlying = std::vector<int,_std::allocator<int>_>::begin(this_00);
    MoptIterator<std::vector<int,_std::allocator<int>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::MoptIterator((MoptIterator<std::vector<int,_std::allocator<int>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *)&this_local,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   _underlying._M_current);
  }
  else {
    MoptIterator<std::vector<int,_std::allocator<int>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::MoptIterator((MoptIterator<std::vector<int,_std::allocator<int>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *)&this_local);
  }
  return (MoptIterator<std::vector<int,_std::allocator<int>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this_local;
}

Assistant:

decltype(auto) begin() {
    if constexpr (details::IsContainerLike<T>()) {
      if (internal_) {
        return MoptIterator<T, typename details::IteratorType<T>::Type>(
            internal_->begin());
      } else {
        return MoptIterator<T, typename details::IteratorType<T>::Type>();
      }
    } else {
      if (internal_) {
        return MoptIterator<T, T*>(&*internal_);
      } else {
        return MoptIterator<T, T*>();
      }
    }
  }